

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::RegisterMessagePrinter
          (Printer *this,Descriptor *descriptor,MessagePrinter *printer)

{
  long in_RDX;
  long in_RSI;
  map<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<const_Descriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  _Var1;
  __enable_if_t<is_constructible<value_type,_pair<const_Descriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  pair;
  pointer in_stack_ffffffffffffff88;
  _Base_ptr *this_00;
  pair<const_google::protobuf::Descriptor_*,_std::nullptr_t> *__x;
  pair<const_google::protobuf::Descriptor_*,_std::nullptr_t> local_40;
  _Base_ptr local_30;
  undefined1 local_28;
  bool local_1;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    this_00 = &in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    __x = &local_40;
    std::make_pair<google::protobuf::Descriptor_const*&,decltype(nullptr)>
              ((Descriptor **)this_00,(void **)in_stack_ffffffffffffff88);
    _Var1 = std::
            map<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>,std::less<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
            ::insert<std::pair<google::protobuf::Descriptor_const*,decltype(nullptr)>>(in_RDI,__x);
    local_30 = (_Base_ptr)_Var1.first._M_node;
    local_28 = _Var1.second;
    if (((undefined1  [16])_Var1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_1 = false;
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>
                    *)0x434ae2);
      std::
      unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
      ::reset((unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
               *)this_00,in_stack_ffffffffffffff88);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool TextFormat::Printer::RegisterMessagePrinter(
    const Descriptor* descriptor, const MessagePrinter* printer) {
  if (descriptor == nullptr || printer == nullptr) {
    return false;
  }
  auto pair =
      custom_message_printers_.insert(std::make_pair(descriptor, nullptr));
  if (pair.second) {
    pair.first->second.reset(printer);
    return true;
  } else {
    return false;
  }
}